

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_declared_builtin_block
          (CompilerGLSL *this,StorageClass storage,ExecutionModel model)

{
  mapped_type mVar1;
  size_t sVar2;
  Variant *pVVar3;
  Decoration *pDVar4;
  _Hash_node_base *p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint3 uVar8;
  SPIRVariable *pSVar9;
  bool bVar10;
  bool bVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  StorageClass SVar14;
  ExecutionModel EVar15;
  SPIRType *pSVar16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  undefined4 extraout_var;
  undefined8 uVar19;
  undefined4 extraout_var_01;
  undefined7 uVar22;
  SPIREntryPoint *pSVar20;
  runtime_error *prVar21;
  uint uVar23;
  BuiltIn BVar24;
  uint **ppuVar25;
  char *ts_1;
  char (*ts_1_00) [3];
  TypedID<(spirv_cross::Types)0> *pTVar26;
  ulong uVar27;
  ID *__k;
  char (*in_R9) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  TypedID<(spirv_cross::Types)0> *pTVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar29;
  long lVar30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar31;
  uint32_t geom_stream;
  uint32_t xfb_buffer;
  uint32_t xfb_stride;
  uint32_t clip_distance_size;
  uint32_t cull_distance_size;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  builtin_xfb_offsets;
  Bitset emitted_builtins;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  Bitset global_builtins;
  Bitset builtins;
  uint32_t local_13a4;
  uint32_t local_13a0;
  uint32_t local_139c;
  CompilerGLSL *local_1398;
  ulong local_1390;
  SPIRVariable *local_1388;
  ulong local_1380;
  SPIRType *local_1378;
  ExecutionModel local_136c;
  uint local_1368 [2];
  SPIRVariable *local_1360;
  ulong local_1358;
  ulong local_1350;
  undefined8 local_1348;
  StorageClass local_133c;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_1338;
  uint *local_1330;
  uint *local_1328;
  TypedID<(spirv_cross::Types)0> *local_1320;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1318;
  string local_12e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_12c0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_12b8;
  undefined1 local_1280 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1168;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1160;
  undefined1 local_1128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1118;
  long lStack_1108;
  char local_1100 [8];
  char local_10f8 [8];
  __node_base_ptr ap_Stack_10f0 [508];
  Buffer *local_110;
  size_t local_108;
  size_t local_100;
  Buffer local_f8 [8];
  undefined4 extraout_var_00;
  
  local_12c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
  local_12b8._M_buckets = &local_12b8._M_single_bucket;
  local_12b8._M_bucket_count = 1;
  local_12b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_12b8._M_element_count = 0;
  local_12b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_12b8._M_rehash_policy._M_next_resize = 0;
  local_12b8._M_single_bucket = (__node_base_ptr)0x0;
  local_1168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
  local_1160._M_buckets = &local_1160._M_single_bucket;
  local_1160._M_bucket_count = 1;
  local_1160._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1160._M_element_count = 0;
  local_1160._M_rehash_policy._M_max_load_factor = 1.0;
  local_1160._M_rehash_policy._M_next_resize = 0;
  local_1160._M_single_bucket = (__node_base_ptr)0x0;
  local_1328 = local_1368 + 1;
  local_1368[1] = 0;
  local_1330 = local_1368;
  local_1368[0] = 0;
  local_139c = 0;
  local_13a0 = 0;
  local_13a4 = 0;
  local_1318._M_buckets = &local_1318._M_single_bucket;
  local_1318._M_bucket_count = 1;
  local_1318._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1318._M_element_count = 0;
  local_1318._M_rehash_policy._M_max_load_factor = 1.0;
  local_1318._M_rehash_policy._M_next_resize = 0;
  local_1318._M_single_bucket = (__node_base_ptr)0x0;
  local_136c = model;
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_1398 = this;
  if (sVar2 == 0) {
    uVar27 = 0;
    local_1390 = 0;
    local_1358 = 0;
    local_1350 = 0;
    local_1360 = (SPIRVariable *)0x0;
  }
  else {
    pTVar28 = (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar26 = pTVar28 + sVar2;
    local_1338 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
    local_1348 = 0;
    local_1380 = 0;
    local_1390 = 0;
    local_1358 = 0;
    local_1350 = 0;
    local_1360 = (SPIRVariable *)0x0;
    local_133c = storage;
    local_1320 = pTVar26;
    do {
      pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[pTVar28->id].type == TypeVariable) {
        local_1388 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + pTVar28->id);
        pSVar16 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(local_1388->super_IVariant).field_0xc);
        bVar10 = Compiler::has_decoration
                           (&this->super_Compiler,(ID)(pSVar16->super_IVariant).self.id,
                            DecorationBlock);
        local_1128._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_1128._8_8_ = ap_Stack_10f0;
        local_1118._M_allocated_capacity = 1;
        local_1118._8_8_ = 0;
        lStack_1108 = 0;
        local_1100[0] = '\0';
        local_1100[1] = '\0';
        local_1100[2] = -0x80;
        local_1100[3] = '?';
        local_10f8[0] = '\0';
        local_10f8[1] = '\0';
        local_10f8[2] = '\0';
        local_10f8[3] = '\0';
        local_10f8[4] = '\0';
        local_10f8[5] = '\0';
        local_10f8[6] = '\0';
        local_10f8[7] = '\0';
        ap_Stack_10f0[0] = (__node_base_ptr)0x0;
        SVar14 = local_1388->storage;
        local_1378 = pSVar16;
        if (bVar10 && SVar14 == storage) {
          bVar11 = Compiler::is_builtin_variable(&this->super_Compiler,local_1388);
          if (!bVar11) {
            SVar14 = local_1388->storage;
            goto LAB_001e26c0;
          }
          pmVar17 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_1338,&(local_1378->super_IVariant).self);
          sVar2 = (pmVar17->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size;
          if (sVar2 != 0) {
            pDVar4 = (pmVar17->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
            lVar30 = 0;
            uVar27 = 0;
            do {
              if (((*(char *)((long)(pDVar4->extended).values + lVar30 + -0x44) == '\x01') &&
                  (uVar23 = *(uint *)((long)(pDVar4->extended).values + lVar30 + -0x80), uVar23 < 5)
                  ) && (uVar23 != 2)) {
                local_1128._0_8_ = local_1128._0_8_ | 1L << ((byte)uVar23 & 0x3f);
                if (uVar23 == 3) {
                  pSVar16 = Variant::get<spirv_cross::SPIRType>
                                      ((this->super_Compiler).ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       (local_1378->member_types).
                                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                       .ptr[uVar27].id);
                  uVar12 = to_array_size_literal
                                     (this,pSVar16,
                                      (int)(pSVar16->array).super_VectorView<unsigned_int>.
                                           buffer_size - 1);
                  ppuVar25 = &local_1330;
LAB_001e253c:
                  **ppuVar25 = uVar12;
                  uVar23 = *(uint *)((long)(pDVar4->extended).values + lVar30 + -0x80);
                }
                else if (uVar23 == 4) {
                  pSVar16 = Variant::get<spirv_cross::SPIRType>
                                      ((this->super_Compiler).ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       (local_1378->member_types).
                                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                       .ptr[uVar27].id);
                  uVar12 = to_array_size_literal
                                     (this,pSVar16,
                                      (int)(pSVar16->array).super_VectorView<unsigned_int>.
                                           buffer_size - 1);
                  ppuVar25 = &local_1328;
                  goto LAB_001e253c;
                }
                if (((uVar23 < 5) && (uVar23 != 2)) &&
                   ((*(byte *)((long)&(pDVar4->decoration_flags).lower + lVar30 + 4) & 8) != 0)) {
                  mVar1 = *(mapped_type *)((long)(pDVar4->extended).values + lVar30 + -0x6c);
                  local_1280._0_4_ = uVar23;
                  pmVar18 = ::std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&local_1318,(key_type *)local_1280);
                  *pmVar18 = mVar1;
                  uVar23 = *(uint *)((long)(pDVar4->extended).values + lVar30 + -0x80);
                  local_1348 = CONCAT71((int7)((ulong)pmVar18 >> 8),1);
                  this = local_1398;
                }
                if (((uVar23 < 5) && (uVar23 != 2)) &&
                   ((*(byte *)((long)&(pDVar4->decoration_flags).lower + lVar30 + 3) & 0x20) != 0))
                {
                  uVar12 = *(uint32_t *)((long)(pDVar4->extended).values + lVar30 + -0x60);
                  if (((local_1380 & 1) != 0) && (local_13a4 != uVar12)) {
                    prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_1280._0_8_ = local_1280 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1280,"IO block member Stream mismatch.","");
                    ::std::runtime_error::runtime_error(prVar21,(string *)local_1280);
                    *(undefined ***)prVar21 = &PTR__runtime_error_003d4e98;
                    __cxa_throw(prVar21,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  local_1380 = CONCAT71((uint7)(uint3)(uVar12 >> 8),1);
                  local_13a4 = uVar12;
                }
              }
              uVar27 = (ulong)((int)uVar27 + 1);
              lVar30 = lVar30 + 0x168;
            } while (sVar2 * 0x168 - lVar30 != 0);
          }
          storage = local_133c;
          pSVar9 = local_1388;
          if (local_133c != StorageClassOutput) goto LAB_001e2862;
          bVar10 = Compiler::has_decoration
                             (&this->super_Compiler,(ID)(local_1388->super_IVariant).self.id,
                              DecorationXfbBuffer);
          if ((bVar10) &&
             (bVar10 = Compiler::has_decoration
                                 (&this->super_Compiler,(ID)(pSVar9->super_IVariant).self.id,
                                  DecorationXfbStride), bVar10)) {
            uVar12 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar9->super_IVariant).self.id,
                                DecorationXfbBuffer);
            uVar13 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar9->super_IVariant).self.id,
                                DecorationXfbStride);
            if ((local_1390 & 1) != 0) {
              if (uVar12 != local_13a0) {
                prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_1280._0_8_ = local_1280 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1280,"IO block member XfbBuffer mismatch.","");
                ::std::runtime_error::runtime_error(prVar21,(string *)local_1280);
                *(undefined ***)prVar21 = &PTR__runtime_error_003d4e98;
                __cxa_throw(prVar21,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              if (uVar13 != local_139c) {
                prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_1280._0_8_ = local_1280 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1280,"IO block member XfbBuffer mismatch.","");
                ::std::runtime_error::runtime_error(prVar21,(string *)local_1280);
                *(undefined ***)prVar21 = &PTR__runtime_error_003d4e98;
                __cxa_throw(prVar21,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
            }
            local_1390 = CONCAT71((int7)(CONCAT44(extraout_var,uVar13) >> 8),1);
            local_13a0 = uVar12;
            local_139c = uVar13;
          }
          bVar10 = Compiler::has_decoration
                             (&this->super_Compiler,(ID)(pSVar9->super_IVariant).self.id,
                              DecorationStream);
          if (!bVar10) goto LAB_001e2862;
          uVar12 = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(local_1388->super_IVariant).self.id,
                              DecorationStream);
          uVar19 = CONCAT44(extraout_var_00,uVar12);
          if (((local_1380 & 1) != 0) && (local_13a4 != uVar12)) {
            prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1280._0_8_ = local_1280 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1280,"IO block member Stream mismatch.","");
            ::std::runtime_error::runtime_error(prVar21,(string *)local_1280);
            *(undefined ***)prVar21 = &PTR__runtime_error_003d4e98;
            __cxa_throw(prVar21,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
LAB_001e2857:
          local_13a4 = (uint32_t)uVar19;
          local_1380 = CONCAT71((int7)((ulong)uVar19 >> 8),1);
        }
        else {
LAB_001e26c0:
          if ((!bVar10 && SVar14 == storage) &&
             (bVar10 = Compiler::is_builtin_variable(&this->super_Compiler,local_1388), bVar10)) {
            __k = &(local_1388->super_IVariant).self;
            pmVar17 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_1338,__k);
            if (((pmVar17->decoration).builtin == true) &&
               ((BVar24 = (pmVar17->decoration).builtin_type, BVar24 < BuiltInVertexId &&
                (BVar24 != 2)))) {
              local_1168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)((ulong)local_1168 | 1L << ((byte)BVar24 & 0x3f));
              if (BVar24 == BuiltInClipDistance) {
                uVar12 = to_array_size_literal
                                   (this,local_1378,
                                    (int)(local_1378->array).super_VectorView<unsigned_int>.
                                         buffer_size - 1);
                ppuVar25 = &local_1330;
LAB_001e276f:
                **ppuVar25 = uVar12;
                BVar24 = (pmVar17->decoration).builtin_type;
              }
              else if (BVar24 == BuiltInCullDistance) {
                uVar12 = to_array_size_literal
                                   (this,local_1378,
                                    (int)(local_1378->array).super_VectorView<unsigned_int>.
                                         buffer_size - 1);
                ppuVar25 = &local_1328;
                goto LAB_001e276f;
              }
              if (((BVar24 < BuiltInVertexId) && (BVar24 != 2)) &&
                 ((~(pmVar17->decoration).decoration_flags.lower & 0x3800000000) == 0)) {
                uVar12 = (pmVar17->decoration).offset;
                local_1280._0_4_ = BVar24;
                pmVar18 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&local_1318,(key_type *)local_1280);
                *pmVar18 = uVar12;
                uVar12 = (pmVar17->decoration).xfb_buffer;
                uVar13 = (pmVar17->decoration).xfb_stride;
                if ((local_1390 & 1) != 0) {
                  if (uVar12 != local_13a0) {
                    prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_1280._0_8_ = local_1280 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1280,"IO block member XfbBuffer mismatch.","");
                    ::std::runtime_error::runtime_error(prVar21,(string *)local_1280);
                    *(undefined ***)prVar21 = &PTR__runtime_error_003d4e98;
                    __cxa_throw(prVar21,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  if (uVar13 != local_139c) {
                    prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_1280._0_8_ = local_1280 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1280,"IO block member XfbBuffer mismatch.","");
                    ::std::runtime_error::runtime_error(prVar21,(string *)local_1280);
                    *(undefined ***)prVar21 = &PTR__runtime_error_003d4e98;
                    __cxa_throw(prVar21,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                }
                BVar24 = (pmVar17->decoration).builtin_type;
                uVar8 = (uint3)(uVar12 >> 8);
                local_1348 = CONCAT71((uint7)uVar8,1);
                local_1390 = (ulong)CONCAT31(uVar8,1);
                local_13a0 = uVar12;
                local_139c = uVar13;
              }
              if (((BVar24 < BuiltInVertexId) && (BVar24 != 2)) &&
                 (((pmVar17->decoration).decoration_flags.lower & 0x20000000) != 0)) {
                uVar12 = Compiler::get_decoration
                                   (&this->super_Compiler,(ID)__k->id,DecorationStream);
                uVar19 = CONCAT44(extraout_var_01,uVar12);
                if (((local_1380 & 1) != 0) && (local_13a4 != uVar12)) {
                  prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_1280._0_8_ = local_1280 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1280,"IO block member Stream mismatch.","");
                  ::std::runtime_error::runtime_error(prVar21,(string *)local_1280);
                  *(undefined ***)prVar21 = &PTR__runtime_error_003d4e98;
                  __cxa_throw(prVar21,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
                goto LAB_001e2857;
              }
            }
          }
        }
LAB_001e2862:
        if (lStack_1108 != 0 ||
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1128._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if ((local_1358 & 1) != 0) {
            prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1280._0_8_ = local_1280 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1280,"Cannot use more than one builtin I/O block.","");
            ::std::runtime_error::runtime_error(prVar21,(string *)local_1280);
            *(undefined ***)prVar21 = &PTR__runtime_error_003d4e98;
            __cxa_throw(prVar21,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_12c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1128._0_8_;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_12b8,
                     (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(local_1128 + 8));
          uVar22 = (undefined7)((ulong)local_1378 >> 8);
          local_1350 = CONCAT71(uVar22,(local_1378->array).super_VectorView<unsigned_int>.
                                       buffer_size != 0);
          local_1358 = CONCAT71(uVar22,1);
          local_1360 = local_1388;
        }
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)(local_1128 + 8));
        pTVar26 = local_1320;
      }
      pTVar28 = pTVar28 + 1;
    } while (pTVar28 != pTVar26);
    local_1390 = CONCAT71((int7)(local_1390 >> 8),(byte)local_1390 & (byte)local_1348);
    uVar27 = local_1380;
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_12e0);
  local_1168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(ulong)((uint)local_1168 & 0x1b);
  ts_1 = (char *)ap_Stack_10f0;
  local_1118._M_allocated_capacity = 1;
  local_1118._8_8_ = 0;
  lStack_1108._0_1_ = '\0';
  lStack_1108._1_1_ = '\0';
  lStack_1108._2_1_ = '\0';
  lStack_1108._3_1_ = '\0';
  lStack_1108._4_1_ = '\0';
  lStack_1108._5_1_ = '\0';
  lStack_1108._6_1_ = '\0';
  lStack_1108._7_1_ = '\0';
  local_1100[0] = '\0';
  local_1100[1] = '\0';
  local_1100[2] = -0x80;
  local_1100[3] = '?';
  local_10f8[0] = '\0';
  local_10f8[1] = '\0';
  local_10f8[2] = '\0';
  local_10f8[3] = '\0';
  local_10f8[4] = '\0';
  local_10f8[5] = '\0';
  local_10f8[6] = '\0';
  local_10f8[7] = '\0';
  ap_Stack_10f0[0] = (__node_base_ptr)0x0;
  local_1128._0_8_ = local_1168;
  local_1128._8_8_ = ts_1;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_move_assign(&local_1160,
                   (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(local_1128 + 8));
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_1128 + 8));
  if ((local_1358 & 1) == 0) {
    local_12c0 = local_1168;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_12b8,&local_1160);
  }
  if (local_12b8._M_element_count != 0 ||
      local_12c0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    if (storage == StorageClassOutput) {
      local_1280._0_8_ = local_1268;
      local_1280._8_8_ = 0;
      local_1280._16_8_ = 8;
      if ((local_1390 & 1) != 0) {
        if ((this->options).es != false) {
          prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1128._0_8_ = &local_1118;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,
                     "Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.","");
          ::std::runtime_error::runtime_error(prVar21,(string *)local_1128);
          *(undefined ***)prVar21 = &PTR__runtime_error_003d4e98;
          __cxa_throw(prVar21,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar23 = (this->options).version;
        if (uVar23 - 0x8c < 300) {
          local_1128._0_8_ = &local_1118;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"GL_ARB_enhanced_layouts","");
          require_extension_internal(local_1398,(string *)local_1128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1128._0_8_ != &local_1118) {
            operator_delete((void *)local_1128._0_8_);
          }
          if ((((local_1398->options).es & 1U) == 0) && ((local_1398->options).version < 0x1b8)) {
            local_1128._0_8_ = &local_1118;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1128,"GL_ARB_enhanced_layouts","");
            require_extension_internal(local_1398,(string *)local_1128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1128._0_8_ != &local_1118) {
              operator_delete((void *)local_1128._0_8_);
            }
          }
        }
        else if (uVar23 < 0x8c) {
          prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1128._0_8_ = &local_1118;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,
                     "Component decoration is not supported in targets below GLSL 1.40.","");
          ::std::runtime_error::runtime_error(prVar21,(string *)local_1128);
          *(undefined ***)prVar21 = &PTR__runtime_error_003d4e98;
          __cxa_throw(prVar21,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ts_1 = ", xfb_stride = ";
        join<char_const(&)[14],unsigned_int&,char_const(&)[16],unsigned_int&>
                  ((string *)local_1128,(spirv_cross *)"xfb_buffer = ",(char (*) [14])&local_13a0,
                   (uint *)", xfb_stride = ",(char (*) [16])&local_139c,(uint *)in_R9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1280,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        this = local_1398;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1128._0_8_ != &local_1118) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      if ((uVar27 & 1) != 0) {
        EVar15 = Compiler::get_execution_model(&this->super_Compiler);
        if (EVar15 != ExecutionModelGeometry) {
          prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1128._0_8_ = &local_1118;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"Geometry streams can only be used in geometry shaders.",
                     "");
          ::std::runtime_error::runtime_error(prVar21,(string *)local_1128);
          *(undefined ***)prVar21 = &PTR__runtime_error_003d4e98;
          __cxa_throw(prVar21,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).es == true) {
          prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1128._0_8_ = &local_1118;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"Multiple geometry streams not supported in ESSL.","");
          ::std::runtime_error::runtime_error(prVar21,(string *)local_1128);
          *(undefined ***)prVar21 = &PTR__runtime_error_003d4e98;
          __cxa_throw(prVar21,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this->options).version < 400) {
          local_1128._0_8_ = &local_1118;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"GL_ARB_transform_feedback3","");
          require_extension_internal(local_1398,(string *)local_1128);
          this = local_1398;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1128._0_8_ != &local_1118) {
            operator_delete((void *)local_1128._0_8_);
            this = local_1398;
          }
        }
        join<char_const(&)[10],unsigned_int&>
                  ((string *)local_1128,(spirv_cross *)"stream = ",(char (*) [10])&local_13a4,
                   (uint *)ts_1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1280,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1128._0_8_ != &local_1118) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      if (local_136c == ExecutionModelMeshEXT) {
        statement<char_const(&)[24]>(this,(char (*) [24])"out gl_MeshPerVertexEXT");
      }
      else if (local_1280._8_8_ == 0) {
        statement<char_const(&)[17]>(this,(char (*) [17])0x3402db);
      }
      else {
        local_110 = local_f8;
        local_1118._M_allocated_capacity = 0;
        local_1128._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_1128._8_8_ = (__node_base_ptr *)0x0;
        local_108 = 0;
        local_100 = 8;
        StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
        if (local_1280._8_8_ != 0) {
          pbVar31 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_1280._0_8_ + local_1280._8_8_ * 0x20);
          pbVar29 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_1280._0_8_;
          do {
            StringStream<4096UL,_4096UL>::append
                      ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar29->_M_dataplus)._M_p,
                       pbVar29->_M_string_length);
            if (pbVar29 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_1280._0_8_ + (local_1280._8_8_ - 1) * 0x20)) {
              StringStream<4096UL,_4096UL>::append
                        ((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
            }
            pbVar29 = pbVar29 + 1;
          } while (pbVar29 != pbVar31);
        }
        StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_12e0,local_1128);
        StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
        this = local_1398;
        statement<char_const(&)[8],std::__cxx11::string,char_const(&)[19]>
                  (local_1398,(char (*) [8])"layout(",&local_12e0,
                   (char (*) [19])") out gl_PerVertex");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_12e0._M_dataplus._M_p != &local_12e0.field_2) {
          operator_delete(local_12e0._M_dataplus._M_p);
        }
      }
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_1280);
    }
    else {
      pSVar20 = Compiler::get_entry_point(&this->super_Compiler);
      if (pSVar20->geometry_passthrough == true) {
        statement<char_const(&)[36]>(this,(char (*) [36])"layout(passthrough) in gl_PerVertex");
      }
      else {
        statement<char_const(&)[16]>(this,(char (*) [16])0x340300);
      }
    }
    statement<char_const(&)[2]>(this,(char (*) [2])0x34a43e);
    this->indent = this->indent + 1;
    if (((ulong)local_12c0 & 1) != 0) {
      if (*local_1318._M_buckets != (__node_base_ptr)0x0) {
        p_Var5 = (*local_1318._M_buckets)->_M_nxt;
        uVar23 = *(uint *)&p_Var5[1]._M_nxt;
        do {
          if (uVar23 == 0) {
            statement<char_const(&)[21],unsigned_int&,char_const(&)[20]>
                      (this,(char (*) [21])"layout(xfb_offset = ",
                       (uint *)((long)&p_Var5[1]._M_nxt + 4),(char (*) [20])") vec4 gl_Position;");
            goto LAB_001e2e1c;
          }
          p_Var5 = p_Var5->_M_nxt;
        } while ((p_Var5 != (_Hash_node_base *)0x0) &&
                (uVar23 = *(uint *)&p_Var5[1]._M_nxt,
                (ulong)uVar23 % local_1318._M_bucket_count == 0));
      }
      statement<char_const(&)[18]>(this,(char (*) [18])0x340327);
    }
LAB_001e2e1c:
    if (((ulong)local_12c0 & 2) != 0) {
      if (local_1318._M_buckets[local_1318._M_bucket_count != 1] != (__node_base_ptr)0x0) {
        p_Var5 = local_1318._M_buckets[local_1318._M_bucket_count != 1]->_M_nxt;
        uVar23 = *(uint *)&p_Var5[1]._M_nxt;
        do {
          if (uVar23 == 1) {
            statement<char_const(&)[21],unsigned_int&,char_const(&)[22]>
                      (this,(char (*) [21])"layout(xfb_offset = ",
                       (uint *)((long)&p_Var5[1]._M_nxt + 4),(char (*) [22])") float gl_PointSize;")
            ;
            goto LAB_001e2e9e;
          }
          p_Var5 = p_Var5->_M_nxt;
        } while ((p_Var5 != (_Hash_node_base *)0x0) &&
                (uVar23 = *(uint *)&p_Var5[1]._M_nxt,
                (uint)((ulong)uVar23 % local_1318._M_bucket_count) ==
                (uint)(local_1318._M_bucket_count != 1)));
      }
      statement<char_const(&)[20]>(this,(char (*) [20])0x34033b);
    }
LAB_001e2e9e:
    if (((ulong)local_12c0 & 8) != 0) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_1318._M_bucket_count;
      uVar27 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
      if (local_1318._M_buckets[uVar27 & 0xffffffff] != (__node_base_ptr)0x0) {
        p_Var5 = local_1318._M_buckets[uVar27 & 0xffffffff]->_M_nxt;
        uVar23 = *(uint *)&p_Var5[1]._M_nxt;
        do {
          if (uVar23 == 3) {
            in_R9 = (char (*) [2])0x347e56;
            statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                      (this,(char (*) [21])"layout(xfb_offset = ",
                       (uint *)((long)&p_Var5[1]._M_nxt + 4),
                       (char (*) [25])") float gl_ClipDistance[",local_1368,(char (*) [3])0x347e56);
            goto LAB_001e2f42;
          }
          p_Var5 = p_Var5->_M_nxt;
        } while ((p_Var5 != (_Hash_node_base *)0x0) &&
                (uVar23 = *(uint *)&p_Var5[1]._M_nxt,
                (ulong)uVar23 % local_1318._M_bucket_count == uVar27));
      }
      statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                (this,(char (*) [23])0x340351,local_1368,(char (*) [3])0x347e56);
    }
LAB_001e2f42:
    if (((ulong)local_12c0 & 0x10) != 0) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_1318._M_bucket_count;
      uVar27 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar7,0);
      if (local_1318._M_buckets[uVar27 & 0xffffffff] != (__node_base_ptr)0x0) {
        p_Var5 = local_1318._M_buckets[uVar27 & 0xffffffff]->_M_nxt;
        uVar23 = *(uint *)&p_Var5[1]._M_nxt;
        do {
          if (uVar23 == 4) {
            in_R9 = (char (*) [2])0x347e56;
            statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                      (this,(char (*) [21])"layout(xfb_offset = ",
                       (uint *)((long)&p_Var5[1]._M_nxt + 4),
                       (char (*) [25])") float gl_CullDistance[",local_1368 + 1,
                       (char (*) [3])0x347e56);
            goto LAB_001e2fe6;
          }
          p_Var5 = p_Var5->_M_nxt;
        } while ((p_Var5 != (_Hash_node_base *)0x0) &&
                (uVar23 = *(uint *)&p_Var5[1]._M_nxt,
                (ulong)uVar23 % local_1318._M_bucket_count == uVar27));
      }
      statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                (this,(char (*) [23])0x34036a,local_1368 + 1,(char (*) [3])0x347e56);
    }
LAB_001e2fe6:
    if ((local_1350 & 1) == 0) {
      end_scope_decl(this);
    }
    else {
      if (local_136c == ExecutionModelTessellationControl && storage == StorageClassOutput) {
        (*(this->super_Compiler)._vptr_Compiler[6])
                  (local_1280,this,(ulong)(local_1360->super_IVariant).self.id,1);
        pSVar20 = Compiler::get_entry_point(&this->super_Compiler);
        join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                  ((string *)local_1128,(spirv_cross *)local_1280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3434bc,
                   (char (*) [2])&pSVar20->output_vertices,(uint *)0x33ba6c,in_R9);
        end_scope_decl(this,(string *)local_1128);
      }
      else {
        ts_1_00 = (char (*) [3])0x1;
        (*(this->super_Compiler)._vptr_Compiler[6])
                  (local_1280,this,(ulong)(local_1360->super_IVariant).self.id);
        join<std::__cxx11::string,char_const(&)[3]>
                  ((string *)local_1128,(spirv_cross *)local_1280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[]",ts_1_00
                  );
        end_scope_decl(this,(string *)local_1128);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1280._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1280 + 0x10))
      {
        operator_delete((void *)local_1280._0_8_);
      }
    }
    statement<char_const(&)[1]>(this,(char (*) [1])0x33bad0);
  }
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1318);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_1160);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_12b8);
  return;
}

Assistant:

void CompilerGLSL::emit_declared_builtin_block(StorageClass storage, ExecutionModel model)
{
	Bitset emitted_builtins;
	Bitset global_builtins;
	const SPIRVariable *block_var = nullptr;
	bool emitted_block = false;
	bool builtin_array = false;

	// Need to use declared size in the type.
	// These variables might have been declared, but not statically used, so we haven't deduced their size yet.
	uint32_t cull_distance_size = 0;
	uint32_t clip_distance_size = 0;

	bool have_xfb_buffer_stride = false;
	bool have_geom_stream = false;
	bool have_any_xfb_offset = false;
	uint32_t xfb_stride = 0, xfb_buffer = 0, geom_stream = 0;
	std::unordered_map<uint32_t, uint32_t> builtin_xfb_offsets;

	const auto builtin_is_per_vertex_set = [](BuiltIn builtin) -> bool {
		return builtin == BuiltInPosition || builtin == BuiltInPointSize ||
			builtin == BuiltInClipDistance || builtin == BuiltInCullDistance;
	};

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		Bitset builtins;

		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t index = 0;
			for (auto &m : ir.meta[type.self].members)
			{
				if (m.builtin && builtin_is_per_vertex_set(m.builtin_type))
				{
					builtins.set(m.builtin_type);
					if (m.builtin_type == BuiltInCullDistance)
						cull_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));
					else if (m.builtin_type == BuiltInClipDistance)
						clip_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationOffset))
					{
						have_any_xfb_offset = true;
						builtin_xfb_offsets[m.builtin_type] = m.offset;
					}

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
					{
						uint32_t stream = m.stream;
						if (have_geom_stream && geom_stream != stream)
							SPIRV_CROSS_THROW("IO block member Stream mismatch.");
						have_geom_stream = true;
						geom_stream = stream;
					}
				}
				index++;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationXfbBuffer) &&
			    has_decoration(var.self, DecorationXfbStride))
			{
				uint32_t buffer_index = get_decoration(var.self, DecorationXfbBuffer);
				uint32_t stride = get_decoration(var.self, DecorationXfbStride);
				if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				if (have_xfb_buffer_stride && stride != xfb_stride)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				have_xfb_buffer_stride = true;
				xfb_buffer = buffer_index;
				xfb_stride = stride;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationStream))
			{
				uint32_t stream = get_decoration(var.self, DecorationStream);
				if (have_geom_stream && geom_stream != stream)
					SPIRV_CROSS_THROW("IO block member Stream mismatch.");
				have_geom_stream = true;
				geom_stream = stream;
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			// While we're at it, collect all declared global builtins (HLSL mostly ...).
			auto &m = ir.meta[var.self].decoration;
			if (m.builtin && builtin_is_per_vertex_set(m.builtin_type))
			{
				global_builtins.set(m.builtin_type);
				if (m.builtin_type == BuiltInCullDistance)
					cull_distance_size = to_array_size_literal(type);
				else if (m.builtin_type == BuiltInClipDistance)
					clip_distance_size = to_array_size_literal(type);

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationXfbStride) &&
				    m.decoration_flags.get(DecorationXfbBuffer) && m.decoration_flags.get(DecorationOffset))
				{
					have_any_xfb_offset = true;
					builtin_xfb_offsets[m.builtin_type] = m.offset;
					uint32_t buffer_index = m.xfb_buffer;
					uint32_t stride = m.xfb_stride;
					if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					if (have_xfb_buffer_stride && stride != xfb_stride)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					have_xfb_buffer_stride = true;
					xfb_buffer = buffer_index;
					xfb_stride = stride;
				}

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
				{
					uint32_t stream = get_decoration(var.self, DecorationStream);
					if (have_geom_stream && geom_stream != stream)
						SPIRV_CROSS_THROW("IO block member Stream mismatch.");
					have_geom_stream = true;
					geom_stream = stream;
				}
			}
		}

		if (builtins.empty())
			return;

		if (emitted_block)
			SPIRV_CROSS_THROW("Cannot use more than one builtin I/O block.");

		emitted_builtins = builtins;
		emitted_block = true;
		builtin_array = !type.array.empty();
		block_var = &var;
	});

	global_builtins =
	    Bitset(global_builtins.get_lower() & ((1ull << BuiltInPosition) | (1ull << BuiltInPointSize) |
	                                          (1ull << BuiltInClipDistance) | (1ull << BuiltInCullDistance)));

	// Try to collect all other declared builtins.
	if (!emitted_block)
		emitted_builtins = global_builtins;

	// Can't declare an empty interface block.
	if (emitted_builtins.empty())
		return;

	if (storage == StorageClassOutput)
	{
		SmallVector<string> attr;
		if (have_xfb_buffer_stride && have_any_xfb_offset)
		{
			if (!options.es)
			{
				if (options.version < 440 && options.version >= 140)
					require_extension_internal("GL_ARB_enhanced_layouts");
				else if (options.version < 140)
					SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
				if (!options.es && options.version < 440)
					require_extension_internal("GL_ARB_enhanced_layouts");
			}
			else if (options.es)
				SPIRV_CROSS_THROW("Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.");
			attr.push_back(join("xfb_buffer = ", xfb_buffer, ", xfb_stride = ", xfb_stride));
		}

		if (have_geom_stream)
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", geom_stream));
		}

		if (model == ExecutionModelMeshEXT)
			statement("out gl_MeshPerVertexEXT");
		else if (!attr.empty())
			statement("layout(", merge(attr), ") out gl_PerVertex");
		else
			statement("out gl_PerVertex");
	}
	else
	{
		// If we have passthrough, there is no way PerVertex cannot be passthrough.
		if (get_entry_point().geometry_passthrough)
			statement("layout(passthrough) in gl_PerVertex");
		else
			statement("in gl_PerVertex");
	}

	begin_scope();
	if (emitted_builtins.get(BuiltInPosition))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPosition);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") vec4 gl_Position;");
		else
			statement("vec4 gl_Position;");
	}

	if (emitted_builtins.get(BuiltInPointSize))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPointSize);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_PointSize;");
		else
			statement("float gl_PointSize;");
	}

	if (emitted_builtins.get(BuiltInClipDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInClipDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_ClipDistance[", clip_distance_size, "];");
		else
			statement("float gl_ClipDistance[", clip_distance_size, "];");
	}

	if (emitted_builtins.get(BuiltInCullDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInCullDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_CullDistance[", cull_distance_size, "];");
		else
			statement("float gl_CullDistance[", cull_distance_size, "];");
	}

	if (builtin_array)
	{
		if (model == ExecutionModelTessellationControl && storage == StorageClassOutput)
			end_scope_decl(join(to_name(block_var->self), "[", get_entry_point().output_vertices, "]"));
		else
			end_scope_decl(join(to_name(block_var->self), "[]"));
	}
	else
		end_scope_decl();
	statement("");
}